

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void webrtc::FilterAdaptation
               (int num_partitions,int x_fft_buf_block_pos,float (*x_fft_buf) [2080],
               float (*e_fft) [65],float (*h_fft_buf) [2080])

{
  int iVar1;
  float fVar2;
  float scale;
  int pos;
  int xPos;
  float fft [128];
  int local_30;
  int local_2c;
  int j;
  int i;
  float (*h_fft_buf_local) [2080];
  float (*e_fft_local) [65];
  float (*x_fft_buf_local) [2080];
  int x_fft_buf_block_pos_local;
  int num_partitions_local;
  
  for (local_2c = 0; local_2c < num_partitions; local_2c = local_2c + 1) {
    scale = (float)((local_2c + x_fft_buf_block_pos) * 0x41);
    if (num_partitions <= local_2c + x_fft_buf_block_pos) {
      scale = (float)((int)scale + num_partitions * -0x41);
    }
    iVar1 = local_2c * 0x41;
    for (local_30 = 0; local_30 < 0x40; local_30 = local_30 + 1) {
      fVar2 = MulRe((*x_fft_buf)[(int)scale + local_30],-x_fft_buf[1][(int)scale + local_30],
                    (*e_fft)[local_30],e_fft[1][local_30]);
      (&pos)[local_30 << 1] = (int)fVar2;
      fVar2 = MulIm((*x_fft_buf)[(int)scale + local_30],-x_fft_buf[1][(int)scale + local_30],
                    (*e_fft)[local_30],e_fft[1][local_30]);
      (&pos)[local_30 * 2 + 1] = (int)fVar2;
    }
    xPos = (int)MulRe((*x_fft_buf)[(int)scale + 0x40],-x_fft_buf[1][(int)scale + 0x40],
                      (*e_fft)[0x40],e_fft[1][0x40]);
    aec_rdft_inverse_128((float *)&pos);
    memset(fft + 0x3e,0,0x100);
    for (local_30 = 0; local_30 < 0x40; local_30 = local_30 + 1) {
      (&pos)[local_30] = (int)((float)(&pos)[local_30] * 0.015625);
    }
    aec_rdft_forward_128((float *)&pos);
    (*h_fft_buf)[iVar1] = (float)pos + (*h_fft_buf)[iVar1];
    (*h_fft_buf)[iVar1 + 0x40] = (float)xPos + (*h_fft_buf)[iVar1 + 0x40];
    for (local_30 = 1; local_30 < 0x40; local_30 = local_30 + 1) {
      (*h_fft_buf)[iVar1 + local_30] = (float)(&pos)[local_30 << 1] + (*h_fft_buf)[iVar1 + local_30]
      ;
      h_fft_buf[1][iVar1 + local_30] =
           (float)(&pos)[local_30 * 2 + 1] + h_fft_buf[1][iVar1 + local_30];
    }
  }
  return;
}

Assistant:

static void FilterAdaptation(
    int num_partitions,
    int x_fft_buf_block_pos,
    float x_fft_buf[2][kExtendedNumPartitions * PART_LEN1],
    float e_fft[2][PART_LEN1],
    float h_fft_buf[2][kExtendedNumPartitions * PART_LEN1]) {
  int i, j;
  float fft[PART_LEN2];
  for (i = 0; i < num_partitions; i++) {
    int xPos = (i + x_fft_buf_block_pos) * (PART_LEN1);
    int pos;
    // Check for wrap
    if (i + x_fft_buf_block_pos >= num_partitions) {
      xPos -= num_partitions * PART_LEN1;
    }

    pos = i * PART_LEN1;

    for (j = 0; j < PART_LEN; j++) {
      fft[2 * j] = MulRe(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                         e_fft[0][j], e_fft[1][j]);
      fft[2 * j + 1] = MulIm(x_fft_buf[0][xPos + j], -x_fft_buf[1][xPos + j],
                             e_fft[0][j], e_fft[1][j]);
    }
    fft[1] =
        MulRe(x_fft_buf[0][xPos + PART_LEN], -x_fft_buf[1][xPos + PART_LEN],
              e_fft[0][PART_LEN], e_fft[1][PART_LEN]);

    aec_rdft_inverse_128(fft);
    memset(fft + PART_LEN, 0, sizeof(float) * PART_LEN);

    // fft scaling
    {
      float scale = 2.0f / PART_LEN2;
      for (j = 0; j < PART_LEN; j++) {
        fft[j] *= scale;
      }
    }
    aec_rdft_forward_128(fft);

    h_fft_buf[0][pos] += fft[0];
    h_fft_buf[0][pos + PART_LEN] += fft[1];

    for (j = 1; j < PART_LEN; j++) {
      h_fft_buf[0][pos + j] += fft[2 * j];
      h_fft_buf[1][pos + j] += fft[2 * j + 1];
    }
  }
}